

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void report_biggest_periods
               (vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *repeats,string *sequence,
               size_t max,int min_size)

{
  pointer pRVar1;
  pointer pRVar2;
  ulong uVar3;
  __normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
  last;
  ostream *poVar4;
  difference_type __d;
  
  pRVar1 = (repeats->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (repeats->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = ((long)pRVar2 - (long)pRVar1) / 0xc;
  if (uVar3 < max) {
    max = uVar3;
  }
  last._M_current = pRVar1 + max;
  std::
  __partial_sort<__gnu_cxx::__normal_iterator<tandem::Repeat*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>,__gnu_cxx::__ops::_Iter_comp_iter<PeriodGreater>>
            (pRVar1,last._M_current,pRVar2);
  if (0 < min_size) {
    last = std::
           __lower_bound<__gnu_cxx::__normal_iterator<tandem::Repeat*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<PeriodGreater>>
                     ((repeats->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)
                      ._M_impl.super__Vector_impl_data._M_start,last._M_current);
  }
  poVar4 = std::operator<<((ostream *)&std::clog,"Printing the ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," repeats with the largest periods");
  std::endl<char,std::char_traits<char>>(poVar4);
  print((repeats->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
        super__Vector_impl_data._M_start,(RepeatIterator)last._M_current,sequence);
  return;
}

Assistant:

void report_biggest_periods(std::vector<tandem::Repeat>& repeats, const std::string& sequence,
                            const std::size_t max, const int min_size = -1)
{
    auto n = std::min(max, repeats.size());
    auto nth = std::next(std::begin(repeats), n);
    std::partial_sort(std::begin(repeats), nth, std::end(repeats), PeriodGreater {});
    if (min_size > 0) {
        nth = std::lower_bound(std::begin(repeats), nth, static_cast<std::size_t>(min_size), PeriodGreater {});
        n = std::distance(std::begin(repeats), nth);
    }
    std::clog << "Printing the " << n << " repeats with the largest periods" << std::endl;
    print(std::begin(repeats), nth, sequence);
}